

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

void __thiscall ddd::DictionarySGL<false,_false>::DictionarySGL(DictionarySGL<false,_false> *this)

{
  Dictionary *in_RDI;
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  *in_stack_ffffffffffffffc8;
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  *this_00;
  
  Dictionary::Dictionary(in_RDI);
  in_RDI->_vptr_Dictionary = (_func_int **)&PTR__DictionarySGL_001b46b0;
  this_00 = (unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
             *)(in_RDI + 1);
  std::
  unique_ptr<ddd::DaTrie<false,false,false>,std::default_delete<ddd::DaTrie<false,false,false>>>::
  unique_ptr<std::default_delete<ddd::DaTrie<false,false,false>>,void>(this_00);
  in_RDI[2]._vptr_Dictionary = (_func_int **)0x0;
  make_unique<ddd::DaTrie<false,false,false>>();
  std::
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  ::operator=(this_00,in_stack_ffffffffffffffc8);
  std::
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

DictionarySGL() {
    trie_ = make_unique<TrieType>();
  }